

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPlotIO.cpp
# Opt level: O1

void __thiscall NaDPlotFile::SetTitle(NaDPlotFile *this,char *szTitle,int iTitleNo)

{
  size_t sVar1;
  char *__dest;
  undefined4 *puVar2;
  
  if (2 < (uint)iTitleNo) {
    return;
  }
  if (szTitle != (char *)0x0) {
    if (this->szTitles[(uint)iTitleNo] != (char *)0x0) {
      operator_delete__(this->szTitles[(uint)iTitleNo]);
    }
    sVar1 = strlen(szTitle);
    __dest = (char *)operator_new__(sVar1 + 1);
    this->szTitles[(uint)iTitleNo] = __dest;
    strcpy(__dest,szTitle);
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

void    NaDPlotFile::SetTitle (const char* szTitle, int iTitleNo)
{
    if(iTitleNo < 0 || iTitleNo >= NaDPLOT_TITLE_NUM)
        // Not so many titles are supported
        return;

    if(NULL == szTitle)
        throw(na_null_pointer);

    delete[] szTitles[iTitleNo];
    szTitles[iTitleNo] = new char[1 + strlen(szTitle)];
    strcpy(szTitles[iTitleNo], szTitle);
}